

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

void __thiscall
slang::syntax::DefaultDisableDeclarationSyntax::setChild
          (DefaultDisableDeclarationSyntax *this,size_t index,TokenOrSyntax child)

{
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *pSVar1;
  SyntaxNode *pSVar2;
  logic_error *this_00;
  Token TVar3;
  ExpressionSyntax *local_168;
  string local_140;
  allocator<char> local_109;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  undefined8 local_68;
  Info *local_60;
  ExpressionSyntax *local_58;
  ExpressionSyntax *local_50;
  undefined8 local_48;
  Info *local_40;
  undefined8 local_38;
  Info *local_30;
  undefined8 local_28;
  Info *local_20;
  size_t local_18;
  size_t index_local;
  DefaultDisableDeclarationSyntax *this_local;
  
  local_18 = index;
  index_local = (size_t)this;
  switch(index) {
  case 0:
    pSVar2 = TokenOrSyntax::node(&child);
    pSVar1 = SyntaxNode::as<slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>>
                       (pSVar2);
    SyntaxList<slang::syntax::AttributeInstanceSyntax>::operator=
              (&(this->super_MemberSyntax).attributes,pSVar1);
    break;
  case 1:
    TVar3 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
    local_28 = TVar3._0_8_;
    (this->defaultKeyword).kind = (undefined2)local_28;
    (this->defaultKeyword).field_0x2 = local_28._2_1_;
    (this->defaultKeyword).numFlags = (NumericTokenFlags)local_28._3_1_;
    (this->defaultKeyword).rawLen = local_28._4_4_;
    local_20 = TVar3.info;
    (this->defaultKeyword).info = local_20;
    break;
  case 2:
    TVar3 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
    local_38 = TVar3._0_8_;
    (this->disableKeyword).kind = (undefined2)local_38;
    (this->disableKeyword).field_0x2 = local_38._2_1_;
    (this->disableKeyword).numFlags = (NumericTokenFlags)local_38._3_1_;
    (this->disableKeyword).rawLen = local_38._4_4_;
    local_30 = TVar3.info;
    (this->disableKeyword).info = local_30;
    break;
  case 3:
    TVar3 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
    local_48 = TVar3._0_8_;
    (this->iffKeyword).kind = (undefined2)local_48;
    (this->iffKeyword).field_0x2 = local_48._2_1_;
    (this->iffKeyword).numFlags = (NumericTokenFlags)local_48._3_1_;
    (this->iffKeyword).rawLen = local_48._4_4_;
    local_40 = TVar3.info;
    (this->iffKeyword).info = local_40;
    break;
  case 4:
    pSVar2 = TokenOrSyntax::node(&child);
    if (pSVar2 == (SyntaxNode *)0x0) {
      local_168 = (ExpressionSyntax *)0x0;
    }
    else {
      pSVar2 = TokenOrSyntax::node(&child);
      local_168 = SyntaxNode::as<slang::syntax::ExpressionSyntax>(pSVar2);
    }
    local_58 = local_168;
    not_null<slang::syntax::ExpressionSyntax*>::not_null<slang::syntax::ExpressionSyntax*,void>
              ((not_null<slang::syntax::ExpressionSyntax*> *)&local_50,&local_58);
    (this->expr).ptr = local_50;
    break;
  case 5:
    TVar3 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
    local_68 = TVar3._0_8_;
    (this->semi).kind = (undefined2)local_68;
    (this->semi).field_0x2 = local_68._2_1_;
    (this->semi).numFlags = (NumericTokenFlags)local_68._3_1_;
    (this->semi).rawLen = local_68._4_4_;
    local_60 = TVar3.info;
    (this->semi).info = local_60;
    break;
  default:
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_108,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/build_O0/extern/slang/source/AllSyntax.cpp"
               ,&local_109);
    std::operator+(&local_e8,&local_108,":");
    std::__cxx11::to_string(&local_140,0xf5b);
    std::operator+(&local_c8,&local_e8,&local_140);
    std::operator+(&local_a8,&local_c8,": ");
    std::operator+(&local_88,&local_a8,"Default case should be unreachable!");
    std::logic_error::logic_error(this_00,(string *)&local_88);
    __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  return;
}

Assistant:

void DefaultDisableDeclarationSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: attributes = child.node()->as<SyntaxList<AttributeInstanceSyntax>>(); return;
        case 1: defaultKeyword = child.token(); return;
        case 2: disableKeyword = child.token(); return;
        case 3: iffKeyword = child.token(); return;
        case 4: expr = child.node() ? &child.node()->as<ExpressionSyntax>() : nullptr; return;
        case 5: semi = child.token(); return;
        default: ASSUME_UNREACHABLE;
    }
}